

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O2

bool __thiscall asl::Var::operator_cast_to_bool(Var *this)

{
  bool bVar1;
  
  switch(this->_type) {
  default:
    return false;
  case NUMBER:
  case FLOAT:
    return (bool)(-((this->field_1)._d != 0.0) & 1);
  case BOOL:
    return (this->field_1)._b;
  case INT:
    bVar1 = (this->field_1)._i == 0;
    break;
  case SSTRING:
    bVar1 = (this->field_1)._b == false;
    break;
  case STRING:
    return 1 < *(int *)((this->field_1)._l + -0x10);
  case ARRAY:
  case DIC:
    return true;
  }
  return !bVar1;
}

Assistant:

Var::operator bool() const
{
	switch (_type) {
	case BOOL:
		return _b;
	case INT:
		return _i != 0;
	case NUMBER:
	case FLOAT:
		return _d != 0;
	case ARRAY:
	case OBJ:
		return true;
	case STRING:
		return _s->length() > 1;
	case SSTRING:
		return _ss[0] != 0;
	case NUL:
		return false;
	default: return false;
	}
}